

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-delayed-accept.c
# Opt level: O0

void do_accept(uv_timer_t *timer_handle)

{
  uv_stream_t *server_00;
  int iVar1;
  uv_tcp_t *tcp;
  uv_loop_t *loop;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  void *eval_b_1;
  void *eval_a_1;
  void *eval_b;
  void *eval_a;
  int r;
  uv_tcp_t *accepted_handle;
  uv_tcp_t *server;
  uv_timer_t *timer_handle_local;
  
  tcp = (uv_tcp_t *)malloc(0xd8);
  if (timer_handle == (uv_timer_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-delayed-accept.c"
            ,0x35,"timer_handle","!=","NULL",0,"!=",0);
    abort();
  }
  if (tcp == (uv_tcp_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-delayed-accept.c"
            ,0x36,"accepted_handle","!=","NULL",0,"!=",0);
    abort();
  }
  loop = uv_default_loop();
  iVar1 = uv_tcp_init(loop,tcp);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-delayed-accept.c"
            ,0x39,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  server_00 = (uv_stream_t *)timer_handle->data;
  iVar1 = uv_accept(server_00,(uv_stream_t *)tcp);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-delayed-accept.c"
            ,0x3d,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  do_accept_called = do_accept_called + 1;
  uv_close((uv_handle_t *)tcp,close_cb);
  if (do_accept_called == 2) {
    uv_close((uv_handle_t *)server_00,close_cb);
  }
  uv_close((uv_handle_t *)timer_handle,close_cb);
  return;
}

Assistant:

static void do_accept(uv_timer_t* timer_handle) {
  uv_tcp_t* server;
  uv_tcp_t* accepted_handle = (uv_tcp_t*)malloc(sizeof *accepted_handle);
  int r;

  ASSERT_NOT_NULL(timer_handle);
  ASSERT_NOT_NULL(accepted_handle);

  r = uv_tcp_init(uv_default_loop(), accepted_handle);
  ASSERT_OK(r);

  server = (uv_tcp_t*)timer_handle->data;
  r = uv_accept((uv_stream_t*)server, (uv_stream_t*)accepted_handle);
  ASSERT_OK(r);

  do_accept_called++;

  /* Immediately close the accepted handle. */
  uv_close((uv_handle_t*)accepted_handle, close_cb);

  /* After accepting the two clients close the server handle */
  if (do_accept_called == 2) {
    uv_close((uv_handle_t*)server, close_cb);
  }

  /* Dispose the timer. */
  uv_close((uv_handle_t*)timer_handle, close_cb);
}